

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::SrcDir_abi_cxx11_(void)

{
  string *in_RDI;
  char in_stack_00000047;
  char *in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  string local_40 [32];
  char *local_20;
  char **local_18;
  undefined8 local_10;
  
  local_20 = "TEST_SRCDIR";
  local_18 = &local_20;
  local_10 = 1;
  GetCurrentExecutableDirectory_abi_cxx11_();
  std::__cxx11::string::c_str();
  GetDirFromEnv_abi_cxx11_
            ((initializer_list<const_char_*>)in_stack_00000050,in_stack_00000048,in_stack_00000047);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}